

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O3

Ivy_Obj_t * Ivy_TableLookup(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  Ivy_Obj_t *pIVar8;
  uint uVar9;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                  ,0x4b,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x8;
  uVar9 = uVar1 & 0xf;
  if (0xfffffffc < uVar9 - 7) {
    if ((uVar9 != 4) &&
       ((pObj->pFanin0 == (Ivy_Obj_t *)0x0 ||
        (*(int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe) < 1)))) {
      __assert_fail("Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                    ,0x4e,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    pIVar3 = pObj->pFanin1;
    if (pIVar3 == (Ivy_Obj_t *)0x0) {
      pIVar8 = pObj->pFanin0;
      piVar6 = (int *)((ulong)pIVar8 & 0xfffffffffffffffe);
    }
    else {
      piVar6 = (int *)((ulong)pIVar3 & 0xfffffffffffffffe);
      pIVar8 = pObj->pFanin0;
      if (*piVar6 != 0) {
        if (pIVar8 == (Ivy_Obj_t *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = *(int *)((ulong)pIVar8 & 0xfffffffffffffffe);
        }
        if (*piVar6 <= iVar7) {
          __assert_fail("Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                        ,0x4f,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
        }
      }
      if (*(int *)(((ulong)pIVar8 & 0xfffffffffffffffe) + 0xc) == 0) {
        return (Ivy_Obj_t *)0x0;
      }
    }
    if (piVar6[3] != 0) {
      iVar7 = p->nTableSize;
      uVar5 = Ivy_Hash(pObj,iVar7);
      uVar2 = p->pTable[(int)uVar5];
      if (uVar2 != 0) {
        do {
          if (((int)uVar2 < 0) || (p->vObjs->nSize <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pIVar4 = (Ivy_Obj_t *)p->vObjs->pArray[uVar2];
          if (((pIVar4->pFanin0 == pIVar8) && (pIVar4->pFanin1 == pIVar3)) &&
             ((*(uint *)&pIVar4->field_0x8 & 0xf) == uVar9 &&
              ((*(uint *)&pIVar4->field_0x8 ^ uVar1) & 0x600) == 0)) {
            return pIVar4;
          }
          uVar5 = (int)(uVar5 + 1) % iVar7;
          uVar2 = p->pTable[(int)uVar5];
        } while (uVar2 != 0);
      }
    }
  }
  return (Ivy_Obj_t *)0x0;
}

Assistant:

Ivy_Obj_t * Ivy_TableLookup( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEntry;
    int i;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return NULL;
    assert( Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0 );
    assert( Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj) );
    if ( Ivy_ObjFanin0(pObj)->nRefs == 0 || (Ivy_ObjChild1(pObj) && Ivy_ObjFanin1(pObj)->nRefs == 0) )
        return NULL;
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
    {
        pEntry = Ivy_ManObj( p, p->pTable[i] );
        if ( Ivy_ObjChild0(pEntry) == Ivy_ObjChild0(pObj) && 
             Ivy_ObjChild1(pEntry) == Ivy_ObjChild1(pObj) && 
             Ivy_ObjInit(pEntry) == Ivy_ObjInit(pObj) && 
             Ivy_ObjType(pEntry) == Ivy_ObjType(pObj) )
            return pEntry;
    }
    return NULL;
}